

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall CLI::App::App(App *this,string *description_)

{
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  string local_38;
  string *local_18;
  string *description__local;
  App *this_local;
  
  local_18 = description_;
  description__local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_38,(string *)description_);
  App(this,&local_38,(App *)0x0);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_68,"-h,--help",&local_69);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_90,"Print this help message and exit",&local_91);
  set_help_flag(this,&local_68,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

App(std::string description_ = "") : App(description_, nullptr) {
        set_help_flag("-h,--help", "Print this help message and exit");
    }